

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O0

CURLcode gzip_do_write(Curl_easy *data,Curl_cwriter *writer,int type,char *buf,size_t nbytes)

{
  ssize_t sVar1;
  Curl_cwriter *pCVar2;
  CURLcode CVar3;
  gzip_status gVar4;
  uInt *puVar5;
  void *pvVar6;
  int iVar7;
  long local_58;
  ssize_t hlen_1;
  ssize_t hlen;
  z_stream *z;
  zlib_writer *zp;
  size_t nbytes_local;
  char *buf_local;
  Curl_cwriter *pCStack_20;
  int type_local;
  Curl_cwriter *writer_local;
  Curl_easy *data_local;
  
  hlen = (ssize_t)&writer[1].next;
  z = (z_stream *)writer;
  zp = (zlib_writer *)nbytes;
  nbytes_local = (size_t)buf;
  buf_local._4_4_ = type;
  pCStack_20 = writer;
  writer_local = (Curl_cwriter *)data;
  if (((type & 1U) == 0) || (nbytes == 0)) {
    data_local._4_4_ = Curl_cwriter_write(data,writer->next,type,buf,nbytes);
  }
  else {
    iVar7 = (int)nbytes;
    if (*(int *)&writer[1].cwt == 6) {
      *(char **)hlen = buf;
      *(int *)&writer[1].ctx = iVar7;
      data_local._4_4_ = inflate_stream(data,writer,type,ZLIB_INIT_GZIP);
    }
    else {
      switch(*(undefined4 *)&writer[1].cwt) {
      case 1:
        gVar4 = check_gzip_header((uchar *)buf,nbytes,&hlen_1);
        pCVar2 = writer_local;
        sVar1 = hlen;
        if (gVar4 != GZIP_OK) {
          if ((gVar4 != GZIP_BAD) && (gVar4 == GZIP_UNDERFLOW)) {
            *(int *)(hlen + 8) = (int)zp;
            pvVar6 = (*Curl_cmalloc)((size_t)*(undefined4 *)(hlen + 8));
            *(void **)hlen = pvVar6;
            if (*(long *)hlen == 0) {
              CVar3 = exit_zlib((Curl_easy *)writer_local,(z_stream *)hlen,&z->avail_out,
                                CURLE_OUT_OF_MEMORY);
              return CVar3;
            }
            memcpy(*(void **)hlen,(void *)nbytes_local,(ulong)*(uint *)(hlen + 8));
            z->avail_out = 4;
            return CURLE_OK;
          }
          puVar5 = &z->avail_out;
          CVar3 = process_zlib_error((Curl_easy *)writer_local,(z_stream *)hlen);
          CVar3 = exit_zlib((Curl_easy *)pCVar2,(z_stream *)sVar1,puVar5,CVar3);
          return CVar3;
        }
        *(size_t *)hlen = nbytes_local + hlen_1;
        *(int *)(hlen + 8) = (int)zp - (int)hlen_1;
        z->avail_out = 5;
        break;
      case 3:
        *(char **)hlen = buf;
        *(int *)&writer[1].ctx = iVar7;
        CVar3 = process_trailer(data,(zlib_writer *)writer);
        return CVar3;
      case 4:
        *(int *)&writer[1].ctx = iVar7 + *(int *)&writer[1].ctx;
        pvVar6 = Curl_saferealloc(*(Curl_cwriter **)hlen,(ulong)*(uint *)&writer[1].ctx);
        *(void **)hlen = pvVar6;
        if (*(long *)hlen == 0) {
          CVar3 = exit_zlib((Curl_easy *)writer_local,(z_stream *)hlen,&z->avail_out,
                            CURLE_OUT_OF_MEMORY);
          return CVar3;
        }
        memcpy((void *)((*(long *)hlen + (ulong)*(uint *)(hlen + 8)) - (long)zp),
               (void *)nbytes_local,(size_t)zp);
        gVar4 = check_gzip_header(*(uchar **)hlen,(ulong)*(uint *)(hlen + 8),&local_58);
        pCVar2 = writer_local;
        sVar1 = hlen;
        if (gVar4 != GZIP_OK) {
          if ((gVar4 != GZIP_BAD) && (gVar4 == GZIP_UNDERFLOW)) {
            return CURLE_OK;
          }
          puVar5 = &z->avail_out;
          CVar3 = process_zlib_error((Curl_easy *)writer_local,(z_stream *)hlen);
          CVar3 = exit_zlib((Curl_easy *)pCVar2,(z_stream *)sVar1,puVar5,CVar3);
          return CVar3;
        }
        (*Curl_cfree)(*(void **)hlen);
        *(size_t *)hlen = (long)zp + ((nbytes_local + local_58) - (ulong)*(uint *)(hlen + 8));
        *(int *)(hlen + 8) = *(int *)(hlen + 8) - (int)local_58;
        z->avail_out = 5;
        break;
      case 5:
      default:
        *(char **)hlen = buf;
        *(int *)&writer[1].ctx = iVar7;
      }
      if (*(int *)(hlen + 8) == 0) {
        data_local._4_4_ = CURLE_OK;
      }
      else {
        data_local._4_4_ =
             inflate_stream((Curl_easy *)writer_local,pCStack_20,buf_local._4_4_,ZLIB_GZIP_INFLATING
                           );
      }
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode gzip_do_write(struct Curl_easy *data,
                                    struct Curl_cwriter *writer, int type,
                                    const char *buf, size_t nbytes)
{
  struct zlib_writer *zp = (struct zlib_writer *) writer;
  z_stream *z = &zp->z;     /* zlib state structure */

  if(!(type & CLIENTWRITE_BODY) || !nbytes)
    return Curl_cwriter_write(data, writer->next, type, buf, nbytes);

  if(zp->zlib_init == ZLIB_INIT_GZIP) {
    /* Let zlib handle the gzip decompression entirely */
    z->next_in = (Bytef *) buf;
    z->avail_in = (uInt) nbytes;
    /* Now uncompress the data */
    return inflate_stream(data, writer, type, ZLIB_INIT_GZIP);
  }

#ifndef OLD_ZLIB_SUPPORT
  /* Support for old zlib versions is compiled away and we are running with
     an old version, so return an error. */
  return exit_zlib(data, z, &zp->zlib_init, CURLE_WRITE_ERROR);

#else
  /* This next mess is to get around the potential case where there is not
   * enough data passed in to skip over the gzip header. If that happens, we
   * malloc a block and copy what we have then wait for the next call. If
   * there still is not enough (this is definitely a worst-case scenario), we
   * make the block bigger, copy the next part in and keep waiting.
   *
   * This is only required with zlib versions < 1.2.0.4 as newer versions
   * can handle the gzip header themselves.
   */

  switch(zp->zlib_init) {
  /* Skip over gzip header? */
  case ZLIB_INIT:
  {
    /* Initial call state */
    ssize_t hlen;

    switch(check_gzip_header((unsigned char *) buf, nbytes, &hlen)) {
    case GZIP_OK:
      z->next_in = (Bytef *) buf + hlen;
      z->avail_in = (uInt) (nbytes - hlen);
      zp->zlib_init = ZLIB_GZIP_INFLATING; /* Inflating stream state */
      break;

    case GZIP_UNDERFLOW:
      /* We need more data so we can find the end of the gzip header. it is
       * possible that the memory block we malloc here will never be freed if
       * the transfer abruptly aborts after this point. Since it is unlikely
       * that circumstances will be right for this code path to be followed in
       * the first place, and it is even more unlikely for a transfer to fail
       * immediately afterwards, it should seldom be a problem.
       */
      z->avail_in = (uInt) nbytes;
      z->next_in = malloc(z->avail_in);
      if(!z->next_in) {
        return exit_zlib(data, z, &zp->zlib_init, CURLE_OUT_OF_MEMORY);
      }
      memcpy(z->next_in, buf, z->avail_in);
      zp->zlib_init = ZLIB_GZIP_HEADER;  /* Need more gzip header data state */
      /* We do not have any data to inflate yet */
      return CURLE_OK;

    case GZIP_BAD:
    default:
      return exit_zlib(data, z, &zp->zlib_init, process_zlib_error(data, z));
    }

  }
  break;

  case ZLIB_GZIP_HEADER:
  {
    /* Need more gzip header data state */
    ssize_t hlen;
    z->avail_in += (uInt) nbytes;
    z->next_in = Curl_saferealloc(z->next_in, z->avail_in);
    if(!z->next_in) {
      return exit_zlib(data, z, &zp->zlib_init, CURLE_OUT_OF_MEMORY);
    }
    /* Append the new block of data to the previous one */
    memcpy(z->next_in + z->avail_in - nbytes, buf, nbytes);

    switch(check_gzip_header(z->next_in, (ssize_t)z->avail_in, &hlen)) {
    case GZIP_OK:
      /* This is the zlib stream data */
      free(z->next_in);
      /* Do not point into the malloced block since we just freed it */
      z->next_in = (Bytef *) buf + hlen + nbytes - z->avail_in;
      z->avail_in = z->avail_in - (uInt)hlen;
      zp->zlib_init = ZLIB_GZIP_INFLATING;   /* Inflating stream state */
      break;

    case GZIP_UNDERFLOW:
      /* We still do not have any data to inflate! */
      return CURLE_OK;

    case GZIP_BAD:
    default:
      return exit_zlib(data, z, &zp->zlib_init, process_zlib_error(data, z));
    }

  }
  break;

  case ZLIB_EXTERNAL_TRAILER:
    z->next_in = (Bytef *) buf;
    z->avail_in = (uInt) nbytes;
    return process_trailer(data, zp);

  case ZLIB_GZIP_INFLATING:
  default:
    /* Inflating stream state */
    z->next_in = (Bytef *) buf;
    z->avail_in = (uInt) nbytes;
    break;
  }

  if(z->avail_in == 0) {
    /* We do not have any data to inflate; wait until next time */
    return CURLE_OK;
  }

  /* We have parsed the header, now uncompress the data */
  return inflate_stream(data, writer, type, ZLIB_GZIP_INFLATING);
#endif
}